

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_stack_000000f0;
  int in_stack_00000104;
  string *in_stack_00000108;
  string *in_stack_00000110;
  size_t *in_stack_fffffffffffffe78;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator *paVar4;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting Coverage Clipper");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar3 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar3,&local_31);
  bVar1 = std::operator==(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Clipping coverage: ");
    poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 0x10));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pcVar3 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar3,&local_69);
    pcVar3 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    pcVar3 = *(char **)(local_10 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pcVar3,&local_b9);
    std::__cxx11::stoi(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,0);
    clipCoverage(in_stack_00000110,in_stack_00000108,in_stack_00000104);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    pcVar3 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,pcVar3,&local_e1);
    bVar1 = std::operator==(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Counting max depth: ");
      poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 0x10));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pcVar3 = *(char **)(local_10 + 0x10);
      paVar4 = &local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,pcVar3,paVar4);
      countCoverage(in_stack_000000f0);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Ended Coverage Clipper");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {


    cout << "Starting Coverage Clipper"<<endl;
    if(std::string(argv[1]) == "--c"){
        cout<<"Clipping coverage: "<<argv[2]<<endl;
        clipCoverage(argv[2],argv[3],stoi(argv[4]));
    }else if(std::string(argv[1]) == "--f"){
        cout<<"Counting max depth: "<<argv[2]<<endl;
        countCoverage(argv[2]);
    }

    cout << "Ended Coverage Clipper"<< endl;


}